

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void xmlParserPrintFileContextInternal(xmlParserInputPtr input,xmlGenericErrorFunc chanl,void *data)

{
  xmlChar *pxVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  xmlChar **local_a0;
  xmlChar *ctnt;
  xmlChar content [81];
  uint local_34;
  uint col;
  uint n;
  xmlChar *base;
  xmlChar *cur;
  void *data_local;
  xmlGenericErrorFunc chanl_local;
  xmlParserInputPtr input_local;
  
  if (input != (xmlParserInputPtr)0x0) {
    base = input->cur;
    while( true ) {
      bVar5 = false;
      if ((input->base < base) && (bVar5 = true, *base != '\n')) {
        bVar5 = *base == '\r';
      }
      if (!bVar5) break;
      base = base + -1;
    }
    local_34 = 0;
    while( true ) {
      bVar5 = false;
      if (((local_34 < 0x50) && (bVar5 = false, input->base < base)) &&
         (bVar5 = false, *base != '\n')) {
        bVar5 = *base != '\r';
      }
      if (!bVar5) break;
      base = base + -1;
      local_34 = local_34 + 1;
    }
    if ((*base == '\n') || (*base == '\r')) {
      base = base + 1;
    }
    pxVar1 = input->cur;
    iVar2 = (int)base;
    local_34 = 0;
    local_a0 = &ctnt;
    while( true ) {
      bVar5 = false;
      if (((*base != '\0') && (bVar5 = false, *base != '\n')) && (bVar5 = false, *base != '\r')) {
        bVar5 = local_34 < 0x50;
      }
      if (!bVar5) break;
      *(xmlChar *)local_a0 = *base;
      local_34 = local_34 + 1;
      local_a0 = (xmlChar **)((long)local_a0 + 1);
      base = base + 1;
    }
    *(undefined1 *)local_a0 = 0;
    (*chanl)(data,"%s\n",&ctnt);
    local_34 = 0;
    local_a0 = &ctnt;
    while( true ) {
      bVar5 = false;
      if (local_34 < (uint)((int)pxVar1 - iVar2)) {
        uVar3 = local_34 + 1;
        bVar4 = local_34 < 0x4f;
        bVar5 = false;
        local_34 = uVar3;
        if (bVar4) {
          bVar5 = *(char *)local_a0 != '\0';
        }
      }
      if (!bVar5) break;
      if (*(char *)local_a0 != '\t') {
        *(char *)local_a0 = ' ';
      }
      local_a0 = (xmlChar **)((long)local_a0 + 1);
    }
    *(char *)local_a0 = '^';
    *(char *)((long)local_a0 + 1) = '\0';
    (*chanl)(data,"%s\n",&ctnt);
  }
  return;
}

Assistant:

static void
xmlParserPrintFileContextInternal(xmlParserInputPtr input ,
		xmlGenericErrorFunc chanl, void *data ) {
    const xmlChar *cur, *base;
    unsigned int n, col;	/* GCC warns if signed, because compared with sizeof() */
    xmlChar  content[81]; /* space for 80 chars + line terminator */
    xmlChar *ctnt;

    if (input == NULL) return;
    cur = input->cur;
    base = input->base;
    /* skip backwards over any end-of-lines */
    while ((cur > base) && ((*(cur) == '\n') || (*(cur) == '\r'))) {
	cur--;
    }
    n = 0;
    /* search backwards for beginning-of-line (to max buff size) */
    while ((n++ < (sizeof(content)-1)) && (cur > base) &&
   (*(cur) != '\n') && (*(cur) != '\r'))
        cur--;
    if ((*(cur) == '\n') || (*(cur) == '\r')) cur++;
    /* calculate the error position in terms of the current position */
    col = input->cur - cur;
    /* search forward for end-of-line (to max buff size) */
    n = 0;
    ctnt = content;
    /* copy selected text to our buffer */
    while ((*cur != 0) && (*(cur) != '\n') &&
   (*(cur) != '\r') && (n < sizeof(content)-1)) {
		*ctnt++ = *cur++;
	n++;
    }
    *ctnt = 0;
    /* print out the selected text */
    chanl(data ,"%s\n", content);
    /* create blank line with problem pointer */
    n = 0;
    ctnt = content;
    /* (leave buffer space for pointer + line terminator) */
    while ((n<col) && (n++ < sizeof(content)-2) && (*ctnt != 0)) {
	if (*(ctnt) != '\t')
	    *(ctnt) = ' ';
	ctnt++;
    }
    *ctnt++ = '^';
    *ctnt = 0;
    chanl(data ,"%s\n", content);
}